

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_header(Curl_easy *data,char *hd,size_t hdlen)

{
  altsvcinfo *asi;
  char *srchost;
  unsigned_short srcport;
  CURLofft CVar1;
  CURLcode CVar2;
  int iVar3;
  time_t tVar4;
  time_t tVar5;
  char *pcVar6;
  bool bVar7;
  _Bool _Var8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_128;
  char *local_120;
  long local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  alpnid local_c4;
  char *local_c0;
  char *local_b8;
  char *auth_1;
  CURLcode check;
  _Bool secure_context;
  char *host;
  time_t date;
  curl_off_t retry_after;
  char *auth;
  char *location;
  char *ptr;
  char *contenttype;
  curl_off_t cStack_58;
  CURLofft offt;
  curl_off_t contentlength;
  char *pcStack_48;
  alpnid id;
  char *v;
  SingleRequest *k;
  connectdata *pcStack_30;
  CURLcode result;
  connectdata *conn;
  size_t hdlen_local;
  char *hd_local;
  Curl_easy *data_local;
  
  pcStack_30 = data->conn;
  v = (char *)&data->req;
  conn = (connectdata *)hdlen;
  hdlen_local = (size_t)hd;
  hd_local = (char *)data;
  switch(*hd) {
  case 'A':
  case 'a':
    if ((data->asi == (altsvcinfo *)0x0) || ((data->conn->handler->flags & 1) == 0)) {
      local_c0 = (char *)0x0;
    }
    else {
      if ((hdlen < 8) || (iVar3 = curl_strnequal("Alt-Svc:",hd,8), iVar3 == 0)) {
        local_b8 = (char *)0x0;
      }
      else {
        local_b8 = (char *)(hdlen_local + 8);
      }
      local_c0 = local_b8;
    }
    pcVar6 = hd_local;
    pcStack_48 = local_c0;
    if (local_c0 != (char *)0x0) {
      if (pcStack_30->httpversion == '\x1e') {
        local_c4 = ALPN_h3;
      }
      else {
        local_c4 = ALPN_h1;
        if (pcStack_30->httpversion == '\x14') {
          local_c4 = ALPN_h2;
        }
      }
      contentlength._4_4_ = local_c4;
      asi = *(altsvcinfo **)(hd_local + 0xab8);
      srchost = (pcStack_30->host).name;
      srcport = curlx_uitous(pcStack_30->remote_port);
      CVar2 = Curl_altsvc_parse((Curl_easy *)pcVar6,asi,local_c0,local_c4,srchost,srcport);
      return CVar2;
    }
    break;
  case 'C':
  case 'c':
    if (((*(uint *)&(data->req).field_0xd9 >> 0xb & 1) == 0) &&
       (((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x21) & 1) == 0)) {
      if ((hdlen < 0xf) || (iVar3 = curl_strnequal("Content-Length:",hd,0xf), iVar3 == 0)) {
        local_f8 = (char *)0x0;
      }
      else {
        local_f8 = (char *)(hdlen_local + 0xf);
      }
      local_100 = local_f8;
    }
    else {
      local_100 = (char *)0x0;
    }
    pcStack_48 = local_100;
    if (local_100 != (char *)0x0) {
      contenttype._4_4_ = curlx_strtoofft(local_100,(char **)0x0,10,&stack0xffffffffffffffa8);
      if (contenttype._4_4_ == CURL_OFFT_OK) {
        *(curl_off_t *)v = cStack_58;
        *(undefined8 *)(v + 8) = *(undefined8 *)v;
      }
      else {
        if (contenttype._4_4_ != CURL_OFFT_FLOW) {
          Curl_failf((Curl_easy *)hd_local,"Invalid Content-Length: value");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (*(long *)(hd_local + 0x720) != 0) {
          Curl_failf((Curl_easy *)hd_local,"Maximum file size exceeded");
          return CURLE_FILESIZE_EXCEEDED;
        }
        Curl_conncontrol(pcStack_30,2);
        if (((hd_local != (char *)0x0) && ((*(ulong *)(hd_local + 0xa9a) >> 0x1c & 1) != 0)) &&
           ((*(long *)(hd_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(hd_local + 0x1328) + 8))))
           ) {
          Curl_infof((Curl_easy *)hd_local,"Overflow Content-Length: value");
        }
      }
      return CURLE_OK;
    }
    if (((*(uint *)(v + 0xd9) >> 0xb & 1) == 0) && (*(long *)(hd_local + 0x858) != 0)) {
      if ((conn < (connectdata *)0x11) ||
         (iVar3 = curl_strnequal("Content-Encoding:",(char *)hdlen_local,0x11), iVar3 == 0)) {
        local_108 = (char *)0x0;
      }
      else {
        local_108 = (char *)(hdlen_local + 0x11);
      }
      local_110 = local_108;
    }
    else {
      local_110 = (char *)0x0;
    }
    pcStack_48 = local_110;
    if (local_110 != (char *)0x0) {
      CVar2 = Curl_build_unencoding_stack((Curl_easy *)hd_local,local_110,0);
      return CVar2;
    }
    if ((conn < (connectdata *)0xd) ||
       (iVar3 = curl_strnequal("Content-Type:",(char *)hdlen_local,0xd), iVar3 == 0)) {
      local_118 = 0;
    }
    else {
      local_118 = hdlen_local + 0xd;
    }
    pcStack_48 = (char *)local_118;
    if (local_118 != 0) {
      ptr = Curl_copy_header_value((char *)hdlen_local);
      if (ptr == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if (*ptr == '\0') {
        (*Curl_cfree)(ptr);
      }
      else {
        (*Curl_cfree)(*(void **)(hd_local + 0x1418));
        hd_local[0x1418] = '\0';
        hd_local[0x1419] = '\0';
        hd_local[0x141a] = '\0';
        hd_local[0x141b] = '\0';
        hd_local[0x141c] = '\0';
        hd_local[0x141d] = '\0';
        hd_local[0x141e] = '\0';
        hd_local[0x141f] = '\0';
        *(char **)(hd_local + 0x1418) = ptr;
      }
      return CURLE_OK;
    }
    if (((((connectdata *)0xa < conn) &&
         (iVar3 = curl_strnequal("Connection:",(char *)hdlen_local,0xb), iVar3 != 0)) &&
        ((connectdata *)0x10 < conn)) &&
       (_Var8 = Curl_compareheader((char *)hdlen_local,"Connection:",0xb,"close",5), _Var8)) {
      Curl_conncontrol(pcStack_30,2);
      return CURLE_OK;
    }
    if (((pcStack_30->httpversion == '\n') && ((connectdata *)0xa < conn)) &&
       ((iVar3 = curl_strnequal("Connection:",(char *)hdlen_local,0xb), iVar3 != 0 &&
        (((connectdata *)0x15 < conn &&
         (_Var8 = Curl_compareheader((char *)hdlen_local,"Connection:",0xb,"keep-alive",10), _Var8))
        )))) {
      Curl_conncontrol(pcStack_30,0);
      if ((hd_local != (char *)0x0) &&
         (((*(ulong *)(hd_local + 0xa9a) >> 0x1c & 1) != 0 &&
          ((*(long *)(hd_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(hd_local + 0x1328) + 8)))))
         )) {
        Curl_infof((Curl_easy *)hd_local,"HTTP/1.0 connection set to keep alive");
      }
      return CURLE_OK;
    }
    if ((*(uint *)(v + 0xd9) >> 0xb & 1) == 0) {
      if ((conn < (connectdata *)0xe) ||
         (iVar3 = curl_strnequal("Content-Range:",(char *)hdlen_local,0xe), iVar3 == 0)) {
        local_120 = (char *)0x0;
      }
      else {
        local_120 = (char *)(hdlen_local + 0xe);
      }
      local_128 = local_120;
    }
    else {
      local_128 = (char *)0x0;
    }
    pcStack_48 = local_128;
    if (local_128 != (char *)0x0) {
      location = local_128;
      while( true ) {
        bVar7 = false;
        if ((*location != '\0') && ((*location < '0' || (bVar7 = false, '9' < *location)))) {
          bVar7 = *location != '*';
        }
        if (!bVar7) break;
        location = location + 1;
      }
      if ((*location < '0') || ('9' < *location)) {
        if (*(int *)(v + 0x4c) < 300) {
          hd_local[0x11a0] = '\0';
          hd_local[0x11a1] = '\0';
          hd_local[0x11a2] = '\0';
          hd_local[0x11a3] = '\0';
          hd_local[0x11a4] = '\0';
          hd_local[0x11a5] = '\0';
          hd_local[0x11a6] = '\0';
          hd_local[0x11a7] = '\0';
        }
      }
      else {
        CVar1 = curlx_strtoofft(location,(char **)0x0,10,(curl_off_t *)(v + 0x40));
        if ((CVar1 == CURL_OFFT_OK) && (*(long *)(hd_local + 0x11a0) == *(long *)(v + 0x40))) {
          *(uint *)(v + 0xd9) = *(uint *)(v + 0xd9) & 0xfffffffb | 4;
        }
      }
    }
    break;
  case 'L':
  case 'l':
    if (((*(uint *)&(data->req).field_0xd9 >> 0xb & 1) == 0) &&
       (((data->set).timecondition != '\0' || ((*(ulong *)&(data->set).field_0x8ca >> 7 & 1) != 0)))
       ) {
      if ((hdlen < 0xe) || (iVar3 = curl_strnequal("Last-Modified:",hd,0xe), iVar3 == 0)) {
        local_138 = (char *)0x0;
      }
      else {
        local_138 = (char *)(hdlen_local + 0xe);
      }
      local_140 = local_138;
    }
    else {
      local_140 = (char *)0x0;
    }
    pcStack_48 = local_140;
    if (local_140 != (char *)0x0) {
      tVar4 = Curl_getdate_capped(local_140);
      *(time_t *)(v + 0xb0) = tVar4;
      if ((*(ulong *)(hd_local + 0xa9a) >> 7 & 1) != 0) {
        *(undefined8 *)(hd_local + 0x13f0) = *(undefined8 *)(v + 0xb0);
      }
      return CURLE_OK;
    }
    if ((((299 < *(int *)(v + 0x4c)) && (*(int *)(v + 0x4c) < 400)) && ((connectdata *)0x8 < conn))
       && ((iVar3 = curl_strnequal("Location:",(char *)hdlen_local,9), iVar3 != 0 &&
           (*(long *)(hd_local + 0x1a8) == 0)))) {
      auth = Curl_copy_header_value((char *)hdlen_local);
      if (auth == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if (*auth == '\0') {
        (*Curl_cfree)(auth);
      }
      else {
        *(char **)(hd_local + 0x1a8) = auth;
        if ((*(ulong *)(hd_local + 0xa9a) >> 0x15 & 1) != 0) {
          pcVar6 = (*Curl_cstrdup)(*(char **)(hd_local + 0x1a8));
          *(char **)(hd_local + 0x1b0) = pcVar6;
          if (*(long *)(hd_local + 0x1b0) == 0) {
            return CURLE_OUT_OF_MEMORY;
          }
          CVar2 = http_perhapsrewind((Curl_easy *)hd_local,pcStack_30);
          if (CVar2 != CURLE_OK) {
            return CVar2;
          }
          *(uint *)(hd_local + 0x13d4) = *(uint *)(hd_local + 0x13d4) & 0xfffffffd | 2;
          k._4_4_ = 0;
        }
      }
    }
    break;
  case 'P':
  case 'p':
    if ((hdlen < 0x11) || (iVar3 = curl_strnequal("Proxy-Connection:",hd,0x11), iVar3 == 0)) {
      local_148 = (char *)0x0;
    }
    else {
      local_148 = (char *)(hdlen_local + 0x11);
    }
    pcStack_48 = local_148;
    if (local_148 != (char *)0x0) {
      if ((((pcStack_30->httpversion == '\n') && (((ulong)pcStack_30->bits & 1) != 0)) &&
          ((connectdata *)0x10 < conn)) &&
         (((iVar3 = curl_strnequal("Proxy-Connection:",(char *)hdlen_local,0x11), iVar3 != 0 &&
           ((connectdata *)0x1b < conn)) &&
          (_Var8 = Curl_compareheader((char *)hdlen_local,"Proxy-Connection:",0x11,"keep-alive",10),
          _Var8)))) {
        Curl_conncontrol(pcStack_30,0);
        if (((hd_local != (char *)0x0) && ((*(ulong *)(hd_local + 0xa9a) >> 0x1c & 1) != 0)) &&
           ((*(long *)(hd_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(hd_local + 0x1328) + 8))))
           ) {
          Curl_infof((Curl_easy *)hd_local,"HTTP/1.0 proxy connection set to keep alive");
        }
      }
      else if ((((pcStack_30->httpversion == '\v') && (((ulong)pcStack_30->bits & 1) != 0)) &&
               ((((connectdata *)0x10 < conn &&
                 (((iVar3 = curl_strnequal("Proxy-Connection:",(char *)hdlen_local,0x11), iVar3 != 0
                   && ((connectdata *)0x16 < conn)) &&
                  (_Var8 = Curl_compareheader((char *)hdlen_local,"Proxy-Connection:",0x11,"close",5
                                             ), _Var8)))) &&
                ((Curl_conncontrol(pcStack_30,1), hd_local != (char *)0x0 &&
                 ((*(ulong *)(hd_local + 0xa9a) >> 0x1c & 1) != 0)))))) &&
              ((*(long *)(hd_local + 0x1328) == 0 ||
               (0 < *(int *)(*(long *)(hd_local + 0x1328) + 8))))) {
        Curl_infof((Curl_easy *)hd_local,"HTTP/1.1 proxy connection set close");
      }
      return CURLE_OK;
    }
    if (((*(int *)(v + 0x4c) == 0x197) && ((connectdata *)0x12 < conn)) &&
       (iVar3 = curl_strnequal("Proxy-authenticate:",(char *)hdlen_local,0x13), iVar3 != 0)) {
      retry_after = (curl_off_t)Curl_copy_header_value((char *)hdlen_local);
      if ((char *)retry_after == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      k._4_4_ = Curl_http_input_auth((Curl_easy *)hd_local,true,(char *)retry_after);
      (*Curl_cfree)((void *)retry_after);
      return k._4_4_;
    }
    break;
  case 'R':
  case 'r':
    if ((hdlen < 0xc) || (iVar3 = curl_strnequal("Retry-After:",hd,0xc), iVar3 == 0)) {
      local_150 = (char *)0x0;
    }
    else {
      local_150 = (char *)(hdlen_local + 0xc);
    }
    pcStack_48 = local_150;
    if (local_150 != (char *)0x0) {
      date = 0;
      curlx_strtoofft(local_150,(char **)0x0,10,&date);
      if ((date == 0) && (tVar4 = Curl_getdate_capped(pcStack_48), tVar4 != -1)) {
        tVar5 = time((time_t *)0x0);
        date = tVar4 - tVar5;
      }
      *(time_t *)(hd_local + 0x1428) = date;
      return CURLE_OK;
    }
    break;
  case 'S':
  case 's':
    if ((data->cookies == (CookieInfo *)0x0) ||
       ((*(uint *)&(data->state).field_0x774 >> 0xb & 1) == 0)) {
      local_168 = (char *)0x0;
    }
    else {
      if ((hdlen < 0xb) || (iVar3 = curl_strnequal("Set-Cookie:",hd,0xb), iVar3 == 0)) {
        local_160 = (char *)0x0;
      }
      else {
        local_160 = (char *)(hdlen_local + 0xb);
      }
      local_168 = local_160;
    }
    pcStack_48 = local_168;
    if (local_168 != (char *)0x0) {
      if (*(long *)(hd_local + 0x1390) == 0) {
        local_170 = (pcStack_30->host).name;
      }
      else {
        local_170 = *(char **)(hd_local + 0x1390);
      }
      _Var8 = true;
      if ((pcStack_30->handler->protocol & 0x80000002) == 0) {
        iVar3 = curl_strequal("localhost",local_170);
        _Var8 = true;
        if (iVar3 == 0) {
          iVar3 = strcmp(local_170,"127.0.0.1");
          _Var8 = true;
          if (iVar3 != 0) {
            iVar3 = strcmp(local_170,"::1");
            _Var8 = iVar3 == 0;
          }
        }
      }
      Curl_share_lock((Curl_easy *)hd_local,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_add((Curl_easy *)hd_local,*(CookieInfo **)(hd_local + 0xaa8),true,false,pcStack_48
                      ,local_170,*(char **)(hd_local + 0x1230),_Var8);
      Curl_share_unlock((Curl_easy *)hd_local,CURL_LOCK_DATA_COOKIE);
      return CURLE_OK;
    }
    if ((*(long *)(hd_local + 0xab0) == 0) || ((pcStack_30->handler->flags & 1) == 0)) {
      local_188 = (char *)0x0;
    }
    else {
      if ((conn < (connectdata *)0x1a) ||
         (iVar3 = curl_strnequal("Strict-Transport-Security:",(char *)hdlen_local,0x1a), iVar3 == 0)
         ) {
        local_180 = (char *)0x0;
      }
      else {
        local_180 = (char *)(hdlen_local + 0x1a);
      }
      local_188 = local_180;
    }
    pcStack_48 = local_188;
    if (((((local_188 != (char *)0x0) &&
          (CVar2 = Curl_hsts_parse(*(hsts **)(hd_local + 0xab0),(pcStack_30->host).name,local_188),
          CVar2 != CURLE_OK)) && (hd_local != (char *)0x0)) &&
        ((*(ulong *)(hd_local + 0xa9a) >> 0x1c & 1) != 0)) &&
       ((*(long *)(hd_local + 0x1328) == 0 || (0 < *(int *)(*(long *)(hd_local + 0x1328) + 8))))) {
      Curl_infof((Curl_easy *)hd_local,"Illegal STS header skipped");
    }
    break;
  case 'T':
  case 't':
    if ((((*(uint *)&(data->req).field_0xd9 >> 0xb & 1) == 0) && ((data->state).httpreq != '\x05'))
       && ((data->req).httpcode != 0x130)) {
      if ((hdlen < 0x12) || (iVar3 = curl_strnequal("Transfer-Encoding:",hd,0x12), iVar3 == 0)) {
        local_190 = (char *)0x0;
      }
      else {
        local_190 = (char *)(hdlen_local + 0x12);
      }
      local_198 = local_190;
    }
    else {
      local_198 = (char *)0x0;
    }
    pcStack_48 = local_198;
    if (local_198 != (char *)0x0) {
      k._4_4_ = Curl_build_unencoding_stack((Curl_easy *)hd_local,local_198,1);
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      if (((*(uint *)(v + 0xd9) >> 0xc & 1) == 0) &&
         ((*(ulong *)(hd_local + 0xa9a) >> 0x16 & 1) != 0)) {
        Curl_conncontrol(pcStack_30,1);
        *(uint *)(v + 0xd9) = *(uint *)(v + 0xd9) & 0xffffbfff | 0x4000;
      }
      return CURLE_OK;
    }
    if ((conn < (connectdata *)0x8) ||
       (iVar3 = curl_strnequal("Trailer:",(char *)hdlen_local,8), iVar3 == 0)) {
      local_1a0 = (char *)0x0;
    }
    else {
      local_1a0 = (char *)(hdlen_local + 8);
    }
    pcStack_48 = local_1a0;
    if (local_1a0 != (char *)0x0) {
      *(uint *)(hd_local + 0x1c9) = *(uint *)(hd_local + 0x1c9) & 0xffffdfff | 0x2000;
      return CURLE_OK;
    }
    break;
  case 'W':
  case 'w':
    if ((((data->req).httpcode == 0x191) && (0x10 < hdlen)) &&
       (iVar3 = curl_strnequal("WWW-Authenticate:",hd,0x11), iVar3 != 0)) {
      pcVar6 = Curl_copy_header_value((char *)hdlen_local);
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      k._4_4_ = Curl_http_input_auth((Curl_easy *)hd_local,false,pcVar6);
      (*Curl_cfree)(pcVar6);
      return k._4_4_;
    }
  }
  if (((pcStack_30->handler->protocol & 0x40000) == 0) ||
     (data_local._4_4_ = Curl_rtsp_parseheader((Curl_easy *)hd_local,(char *)hdlen_local),
     data_local._4_4_ == CURLE_OK)) {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_header(struct Curl_easy *data,
                          const char *hd, size_t hdlen)
{
  struct connectdata *conn = data->conn;
  CURLcode result;
  struct SingleRequest *k = &data->req;
  const char *v;

  switch(hd[0]) {
  case 'a':
  case 'A':
#ifndef CURL_DISABLE_ALTSVC
    v = (data->asi &&
         ((data->conn->handler->flags & PROTOPT_SSL) ||
#ifdef DEBUGBUILD
          /* allow debug builds to circumvent the HTTPS restriction */
          getenv("CURL_ALTSVC_HTTP")
#else
          0
#endif
        )) ? HD_VAL(hd, hdlen, "Alt-Svc:") : NULL;
    if(v) {
      /* the ALPN of the current request */
      enum alpnid id = (conn->httpversion == 30) ? ALPN_h3 :
                         (conn->httpversion == 20) ? ALPN_h2 : ALPN_h1;
      return Curl_altsvc_parse(data, data->asi, v, id, conn->host.name,
                               curlx_uitous((unsigned int)conn->remote_port));
    }
#endif
    break;
  case 'c':
  case 'C':
    /* Check for Content-Length: header lines to get size */
    v = (!k->http_bodyless && !data->set.ignorecl) ?
      HD_VAL(hd, hdlen, "Content-Length:") : NULL;
    if(v) {
      curl_off_t contentlength;
      CURLofft offt = curlx_strtoofft(v, NULL, 10, &contentlength);

      if(offt == CURL_OFFT_OK) {
        k->size = contentlength;
        k->maxdownload = k->size;
      }
      else if(offt == CURL_OFFT_FLOW) {
        /* out of range */
        if(data->set.max_filesize) {
          failf(data, "Maximum file size exceeded");
          return CURLE_FILESIZE_EXCEEDED;
        }
        streamclose(conn, "overflow content-length");
        infof(data, "Overflow Content-Length: value");
      }
      else {
        /* negative or just rubbish - bad HTTP */
        failf(data, "Invalid Content-Length: value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      return CURLE_OK;
    }
    v = (!k->http_bodyless && data->set.str[STRING_ENCODING]) ?
      HD_VAL(hd, hdlen, "Content-Encoding:") : NULL;
    if(v) {
      /*
       * Process Content-Encoding. Look for the values: identity,
       * gzip, deflate, compress, x-gzip and x-compress. x-gzip and
       * x-compress are the same as gzip and compress. (Sec 3.5 RFC
       * 2616). zlib cannot handle compress. However, errors are
       * handled further down when the response body is processed
       */
      return Curl_build_unencoding_stack(data, v, FALSE);
    }
    /* check for Content-Type: header lines to get the MIME-type */
    v = HD_VAL(hd, hdlen, "Content-Type:");
    if(v) {
      char *contenttype = Curl_copy_header_value(hd);
      if(!contenttype)
        return CURLE_OUT_OF_MEMORY;
      if(!*contenttype)
        /* ignore empty data */
        free(contenttype);
      else {
        Curl_safefree(data->info.contenttype);
        data->info.contenttype = contenttype;
      }
      return CURLE_OK;
    }
    if(HD_IS_AND_SAYS(hd, hdlen, "Connection:", "close")) {
      /*
       * [RFC 2616, section 8.1.2.1]
       * "Connection: close" is HTTP/1.1 language and means that
       * the connection will close when this request has been
       * served.
       */
      streamclose(conn, "Connection: close used");
      return CURLE_OK;
    }
    if((conn->httpversion == 10) &&
       HD_IS_AND_SAYS(hd, hdlen, "Connection:", "keep-alive")) {
      /*
       * An HTTP/1.0 reply with the 'Connection: keep-alive' line
       * tells us the connection will be kept alive for our
       * pleasure. Default action for 1.0 is to close.
       *
       * [RFC2068, section 19.7.1] */
      connkeep(conn, "Connection keep-alive");
      infof(data, "HTTP/1.0 connection set to keep alive");
      return CURLE_OK;
    }
    v = !k->http_bodyless ? HD_VAL(hd, hdlen, "Content-Range:") : NULL;
    if(v) {
      /* Content-Range: bytes [num]-
         Content-Range: bytes: [num]-
         Content-Range: [num]-
         Content-Range: [asterisk]/[total]

         The second format was added since Sun's webserver
         JavaWebServer/1.1.1 obviously sends the header this way!
         The third added since some servers use that!
         The fourth means the requested range was unsatisfied.
      */

      const char *ptr = v;

      /* Move forward until first digit or asterisk */
      while(*ptr && !ISDIGIT(*ptr) && *ptr != '*')
        ptr++;

      /* if it truly stopped on a digit */
      if(ISDIGIT(*ptr)) {
        if(!curlx_strtoofft(ptr, NULL, 10, &k->offset)) {
          if(data->state.resume_from == k->offset)
            /* we asked for a resume and we got it */
            k->content_range = TRUE;
        }
      }
      else if(k->httpcode < 300)
        data->state.resume_from = 0; /* get everything */
    }
    break;
  case 'l':
  case 'L':
    v = (!k->http_bodyless &&
         (data->set.timecondition || data->set.get_filetime)) ?
        HD_VAL(hd, hdlen, "Last-Modified:") : NULL;
    if(v) {
      k->timeofdoc = Curl_getdate_capped(v);
      if(data->set.get_filetime)
        data->info.filetime = k->timeofdoc;
      return CURLE_OK;
    }
    if((k->httpcode >= 300 && k->httpcode < 400) &&
            HD_IS(hd, hdlen, "Location:") &&
            !data->req.location) {
      /* this is the URL that the server advises us to use instead */
      char *location = Curl_copy_header_value(hd);
      if(!location)
        return CURLE_OUT_OF_MEMORY;
      if(!*location)
        /* ignore empty data */
        free(location);
      else {
        data->req.location = location;

        if(data->set.http_follow_location) {
          DEBUGASSERT(!data->req.newurl);
          data->req.newurl = strdup(data->req.location); /* clone */
          if(!data->req.newurl)
            return CURLE_OUT_OF_MEMORY;

          /* some cases of POST and PUT etc needs to rewind the data
             stream at this point */
          result = http_perhapsrewind(data, conn);
          if(result)
            return result;

          /* mark the next request as a followed location: */
          data->state.this_is_a_follow = TRUE;
        }
      }
    }
    break;
  case 'p':
  case 'P':
#ifndef CURL_DISABLE_PROXY
    v = HD_VAL(hd, hdlen, "Proxy-Connection:");
    if(v) {
      if((conn->httpversion == 10) && conn->bits.httpproxy &&
         HD_IS_AND_SAYS(hd, hdlen, "Proxy-Connection:", "keep-alive")) {
        /*
         * When an HTTP/1.0 reply comes when using a proxy, the
         * 'Proxy-Connection: keep-alive' line tells us the
         * connection will be kept alive for our pleasure.
         * Default action for 1.0 is to close.
         */
        connkeep(conn, "Proxy-Connection keep-alive"); /* do not close */
        infof(data, "HTTP/1.0 proxy connection set to keep alive");
      }
      else if((conn->httpversion == 11) && conn->bits.httpproxy &&
              HD_IS_AND_SAYS(hd, hdlen, "Proxy-Connection:", "close")) {
        /*
         * We get an HTTP/1.1 response from a proxy and it says it will
         * close down after this transfer.
         */
        connclose(conn, "Proxy-Connection: asked to close after done");
        infof(data, "HTTP/1.1 proxy connection set close");
      }
      return CURLE_OK;
    }
#endif
    if((407 == k->httpcode) && HD_IS(hd, hdlen, "Proxy-authenticate:")) {
      char *auth = Curl_copy_header_value(hd);
      if(!auth)
        return CURLE_OUT_OF_MEMORY;
      result = Curl_http_input_auth(data, TRUE, auth);
      free(auth);
      return result;
    }
#ifdef USE_SPNEGO
    if(HD_IS(hd, hdlen, "Persistent-Auth:")) {
      struct negotiatedata *negdata = &conn->negotiate;
      struct auth *authp = &data->state.authhost;
      if(authp->picked == CURLAUTH_NEGOTIATE) {
        char *persistentauth = Curl_copy_header_value(hd);
        if(!persistentauth)
          return CURLE_OUT_OF_MEMORY;
        negdata->noauthpersist = checkprefix("false", persistentauth) ?
          TRUE : FALSE;
        negdata->havenoauthpersist = TRUE;
        infof(data, "Negotiate: noauthpersist -> %d, header part: %s",
              negdata->noauthpersist, persistentauth);
        free(persistentauth);
      }
    }
#endif
    break;
  case 'r':
  case 'R':
    v = HD_VAL(hd, hdlen, "Retry-After:");
    if(v) {
      /* Retry-After = HTTP-date / delay-seconds */
      curl_off_t retry_after = 0; /* zero for unknown or "now" */
      /* Try it as a decimal number, if it works it is not a date */
      (void)curlx_strtoofft(v, NULL, 10, &retry_after);
      if(!retry_after) {
        time_t date = Curl_getdate_capped(v);
        if(-1 != date)
          /* convert date to number of seconds into the future */
          retry_after = date - time(NULL);
      }
      data->info.retry_after = retry_after; /* store it */
      return CURLE_OK;
    }
    break;
  case 's':
  case 'S':
#if !defined(CURL_DISABLE_COOKIES)
    v = (data->cookies && data->state.cookie_engine) ?
        HD_VAL(hd, hdlen, "Set-Cookie:") : NULL;
    if(v) {
      /* If there is a custom-set Host: name, use it here, or else use
       * real peer hostname. */
      const char *host = data->state.aptr.cookiehost ?
        data->state.aptr.cookiehost : conn->host.name;
      const bool secure_context =
        conn->handler->protocol&(CURLPROTO_HTTPS|CURLPROTO_WSS) ||
        strcasecompare("localhost", host) ||
        !strcmp(host, "127.0.0.1") ||
        !strcmp(host, "::1") ? TRUE : FALSE;

      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE,
                      CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_add(data, data->cookies, TRUE, FALSE, v, host,
                      data->state.up.path, secure_context);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
      return CURLE_OK;
    }
#endif
#ifndef CURL_DISABLE_HSTS
    /* If enabled, the header is incoming and this is over HTTPS */
    v = (data->hsts &&
         ((conn->handler->flags & PROTOPT_SSL) ||
#ifdef DEBUGBUILD
           /* allow debug builds to circumvent the HTTPS restriction */
           getenv("CURL_HSTS_HTTP")
#else
           0
#endif
            )
        ) ? HD_VAL(hd, hdlen, "Strict-Transport-Security:") : NULL;
    if(v) {
      CURLcode check =
        Curl_hsts_parse(data->hsts, conn->host.name, v);
      if(check)
        infof(data, "Illegal STS header skipped");
#ifdef DEBUGBUILD
      else
        infof(data, "Parsed STS header fine (%zu entries)",
              Curl_llist_count(&data->hsts->list));
#endif
    }
#endif
    break;
  case 't':
  case 'T':
    /* RFC 9112, ch. 6.1
     * "Transfer-Encoding MAY be sent in a response to a HEAD request or
     *  in a 304 (Not Modified) response (Section 15.4.5 of [HTTP]) to a
     *  GET request, neither of which includes a message body, to indicate
     *  that the origin server would have applied a transfer coding to the
     *  message body if the request had been an unconditional GET."
     *
     * Read: in these cases the 'Transfer-Encoding' does not apply
     * to any data following the response headers. Do not add any decoders.
     */
    v = (!k->http_bodyless &&
         (data->state.httpreq != HTTPREQ_HEAD) &&
         (k->httpcode != 304)) ?
      HD_VAL(hd, hdlen, "Transfer-Encoding:") : NULL;
    if(v) {
      /* One or more encodings. We check for chunked and/or a compression
         algorithm. */
      result = Curl_build_unencoding_stack(data, v, TRUE);
      if(result)
        return result;
      if(!k->chunk && data->set.http_transfer_encoding) {
        /* if this is not chunked, only close can signal the end of this
         * transfer as Content-Length is said not to be trusted for
         * transfer-encoding! */
        connclose(conn, "HTTP/1.1 transfer-encoding without chunks");
        k->ignore_cl = TRUE;
      }
      return CURLE_OK;
    }
    v = HD_VAL(hd, hdlen, "Trailer:");
    if(v) {
      data->req.resp_trailer = TRUE;
      return CURLE_OK;
    }
    break;
  case 'w':
  case 'W':
    if((401 == k->httpcode) && HD_IS(hd, hdlen, "WWW-Authenticate:")) {
      char *auth = Curl_copy_header_value(hd);
      if(!auth)
        return CURLE_OUT_OF_MEMORY;
      result = Curl_http_input_auth(data, FALSE, auth);
      free(auth);
      return result;
    }
    break;
  }

  if(conn->handler->protocol & CURLPROTO_RTSP) {
    result = Curl_rtsp_parseheader(data, hd);
    if(result)
      return result;
  }
  return CURLE_OK;
}